

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O2

void solver_debug_check_trail(solver_t *s)

{
  uint *puVar1;
  uint uVar2;
  vec_uint_t *pvVar3;
  long lVar4;
  FILE *__stream;
  byte bVar5;
  char cVar6;
  vec_uint_t *p;
  uint *puVar7;
  size_t __size;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = 1;
  p = (vec_uint_t *)calloc(1,0x10);
  fprintf(_stdout,"[Satoko] Checking for trail(%u) inconsistencies...\n",(ulong)s->trail->size);
  if ((p != (vec_uint_t *)0x0) && (pvVar3 = s->trail, pvVar3 != (vec_uint_t *)0x0)) {
    uVar2 = pvVar3->cap;
    if ((ulong)uVar2 == 0) {
      __size = 0;
      puVar7 = (uint *)0x0;
    }
    else {
      __size = (ulong)uVar2 * 4;
      puVar7 = (uint *)malloc(__size);
      p->data = puVar7;
      if (puVar7 == (uint *)0x0) {
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x5f,"void vec_uint_resize(vec_uint_t *, unsigned int)");
      }
      p->cap = uVar2;
    }
    memcpy(puVar7,pvVar3->data,__size);
    uVar2 = pvVar3->size;
    p->size = uVar2;
    qsort(puVar7,(ulong)uVar2,4,vec_uint_asc_compare);
    puVar7 = vec_uint_data(p);
    do {
      if (uVar2 <= uVar8) {
        uVar8 = 0;
        do {
          uVar9 = uVar8;
          if (p->size <= uVar9) {
            fwrite("[Satoko] Trail OK.\n",0x13,1,_stdout);
            vec_uint_print(p);
            free(p->data);
            free(p);
            return;
          }
          bVar5 = var_value(s,puVar7[uVar9] >> 1);
          __stream = _stdout;
          uVar8 = uVar9 + 1;
        } while (bVar5 == ((byte)puVar7[uVar9] & 1));
        cVar6 = vec_char_at(s->assigns,puVar7[uVar9] >> 1);
        fprintf(__stream,"[Satoko] Inconsistent trail assignment: %u, %u\n",(ulong)(uint)(int)cVar6,
                (ulong)puVar7[uVar9]);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver.c"
                      ,0x2cb,"void solver_debug_check_trail(solver_t *)");
      }
      lVar4 = uVar8 - 1;
      puVar1 = puVar7 + uVar8;
      uVar8 = uVar8 + 1;
    } while ((*puVar1 ^ puVar7[lVar4]) != 1);
    fprintf(_stdout,"[Satoko] Inconsistent trail: %u %u\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver.c"
                  ,0x2c4,"void solver_debug_check_trail(solver_t *)");
  }
  __assert_fail("dest != NULL && src != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                ,0xa0,"void vec_uint_duplicate(vec_uint_t *, const vec_uint_t *)");
}

Assistant:

void solver_debug_check_trail(solver_t *s)
{
    unsigned i;
    unsigned *array;
    vec_uint_t *trail_dup = vec_uint_alloc(0);
    fprintf(stdout, "[Satoko] Checking for trail(%u) inconsistencies...\n", vec_uint_size(s->trail));
    vec_uint_duplicate(trail_dup, s->trail);
    vec_uint_sort(trail_dup, 1);
    array = vec_uint_data(trail_dup);
    for (i = 1; i < vec_uint_size(trail_dup); i++) {
        if (array[i - 1] == lit_compl(array[i])) {
            fprintf(stdout, "[Satoko] Inconsistent trail: %u %u\n", array[i - 1], array[i]);
            assert(0);
            return;
        }
    }
    for (i = 0; i < vec_uint_size(trail_dup); i++) {
        if (var_value(s, lit2var(array[i])) != lit_polarity(array[i])) {
            fprintf(stdout, "[Satoko] Inconsistent trail assignment: %u, %u\n", vec_char_at(s->assigns, lit2var(array[i])), array[i]);
            assert(0);
            return;
        }
    }
    fprintf(stdout, "[Satoko] Trail OK.\n");
    vec_uint_print(trail_dup);
    vec_uint_free(trail_dup);

}